

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

void crnlib::MatchFinder_Init(CMatchFinder *p)

{
  uint local_14;
  UInt32 i;
  CMatchFinder *p_local;
  
  for (local_14 = 0; local_14 < p->hashSizeSum; local_14 = local_14 + 1) {
    p->hash[local_14] = 0;
  }
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->streamPos = p->cyclicBufferSize;
  p->pos = p->cyclicBufferSize;
  p->result = 0;
  p->streamEndWasReached = 0;
  MatchFinder_ReadBlock(p);
  MatchFinder_SetLimits(p);
  return;
}

Assistant:

void MatchFinder_Init(CMatchFinder* p) {
  UInt32 i;
  for (i = 0; i < p->hashSizeSum; i++)
    p->hash[i] = kEmptyHashValue;
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->pos = p->streamPos = p->cyclicBufferSize;
  p->result = SZ_OK;
  p->streamEndWasReached = 0;
  MatchFinder_ReadBlock(p);
  MatchFinder_SetLimits(p);
}